

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> * __thiscall
libtorrent::bdecode_node::dict_at
          (pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
           *__return_storage_ptr__,bdecode_node *this,int i)

{
  bdecode_token *tokens;
  bdecode_token bVar1;
  bdecode_token bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bdecode_node local_b0;
  bdecode_node local_70;
  
  iVar5 = this->m_last_index;
  if (iVar5 == -1 || i < iVar5) {
    iVar6 = this->m_token_idx + 1;
    iVar5 = 0;
  }
  else {
    iVar6 = this->m_last_token;
  }
  tokens = this->m_root_tokens;
  iVar3 = i - iVar5;
  if (iVar3 != 0 && iVar5 <= i) {
    do {
      iVar6 = iVar6 + (*(uint *)&tokens[iVar6].field_0x4 & 0x1fffffff);
      iVar6 = iVar6 + (*(uint *)&tokens[iVar6].field_0x4 & 0x1fffffff);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  if (0 < i) {
    this->m_last_token = iVar6;
    this->m_last_index = i;
  }
  uVar4 = *(uint *)&tokens[iVar6].field_0x4;
  bdecode_node(&local_b0,tokens,this->m_buffer,this->m_buffer_size,iVar6);
  bVar1 = local_b0.m_root_tokens[local_b0.m_token_idx];
  bVar2 = local_b0.m_root_tokens[(long)local_b0.m_token_idx + 1];
  bdecode_node(&local_70,tokens,this->m_buffer,this->m_buffer_size,(uVar4 & 0x1fffffff) + iVar6);
  uVar4 = bVar1._0_4_ & 0x1fffffff;
  (__return_storage_ptr__->first).ptr_ =
       local_b0.m_buffer + ((ulong)bVar1 >> 0x3d) + (ulong)uVar4 + 2;
  (__return_storage_ptr__->first).len_ =
       (long)(int)(((bVar2._0_4_ & 0x1fffffff) - (uVar4 + (bVar1._4_4_ >> 0x1d))) + -2);
  bdecode_node(&__return_storage_ptr__->second,&local_70);
  if (local_70.m_tokens.
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.m_tokens.
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.m_tokens.
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_tokens.
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, bdecode_node> bdecode_node::dict_at(int i) const
	{
		TORRENT_ASSERT(type() == dict_t);
		TORRENT_ASSERT(m_token_idx != -1);

		bdecode_token const* tokens = m_root_tokens;
		TORRENT_ASSERT(tokens[m_token_idx].type == bdecode_token::dict);

		int token = m_token_idx + 1;
		int item = 0;

		// do we have a lookup cached?
		if (m_last_index <= i && m_last_index != -1)
		{
			token = m_last_token;
			item = m_last_index;
		}

		while (item < i)
		{
			TORRENT_ASSERT(tokens[token].type == bdecode_token::string);

			// skip the key
			token += tokens[token].next_item;
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

			// skip the value
			token += tokens[token].next_item;

			++item;

			// index 'i' out of range
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);
		}

		// there's no point in caching the first item
		if (i > 0)
		{
			m_last_token = token;
			m_last_index = i;
		}

		int value_token = token + tokens[token].next_item;
		TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

		return std::make_pair(
			bdecode_node(tokens, m_buffer, m_buffer_size, token).string_value()
			, bdecode_node(tokens, m_buffer, m_buffer_size, value_token));
	}